

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::anon_unknown_2::DepthClearCase::test(DepthClearCase *this)

{
  int iVar1;
  float fVar2;
  Random rnd;
  deRandom local_30;
  
  deRandom_init(&local_30,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[3])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar1 = 0x78;
  do {
    fVar2 = deRandom_getFloat(&local_30);
    glu::CallLogWrapper::glClearDepthf(&(this->super_ApiCase).super_CallLogWrapper,fVar2 + 0.0);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (fVar2 + 0.0,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, 1);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat ref = rnd.getFloat(0, 1);

			glClearDepthf(ref);
			m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, ref);
			expectError(GL_NO_ERROR);
		}
	}